

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O2

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  int iVar1;
  Mat local_68;
  
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  Mat::operator=(top_blob,bottom_blob);
  if (iVar1 == 2) {
    if (this->expand_w == 0) {
      if (this->expand_h == 0) {
        if (this->expand_c == 0) goto LAB_0012179b;
        Mat::reshape(&local_68,bottom_blob,_w,_h,1,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
      else {
        Mat::reshape(&local_68,bottom_blob,_w,1,_h,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
    }
    else {
      Mat::reshape(&local_68,bottom_blob,1,_w,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
  }
  else {
    if (iVar1 != 1) goto LAB_0012179b;
    if (this->expand_w == 0) {
      if (this->expand_h == 0) goto LAB_0012179b;
      if (this->expand_c == 0) {
        Mat::reshape(&local_68,bottom_blob,_w,1,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
      else {
        Mat::reshape(&local_68,bottom_blob,_w,1,1,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
    }
    else if (this->expand_h == 0) {
      if (this->expand_c == 0) {
        Mat::reshape(&local_68,bottom_blob,1,_w,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
      else {
        Mat::reshape(&local_68,bottom_blob,1,_w,1,opt->blob_allocator);
        Mat::operator=(top_blob,&local_68);
      }
    }
    else {
      Mat::reshape(&local_68,bottom_blob,1,1,_w,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
  }
  Mat::~Mat(&local_68);
LAB_0012179b:
  if ((top_blob->data == (void *)0x0) || (iVar1 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (expand_w)
        {
            if (expand_h)
                top_blob = bottom_blob.reshape(1, 1, w, opt.blob_allocator);
            else if (expand_c)
                top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (expand_h)
        {
            if (expand_c)
                top_blob = bottom_blob.reshape(w, 1, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }
    else if (dims == 2)
    {
        if (expand_w)
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        else if (expand_h)
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        else if (expand_c)
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}